

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.h
# Opt level: O2

void __thiscall s2coding::StringVectorEncoder::Add(StringVectorEncoder *this,string *str)

{
  size_t __n;
  size_t local_20;
  
  local_20 = Encoder::length(&this->data_);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>(&this->offsets_,&local_20);
  Encoder::Ensure(&this->data_,str->_M_string_length);
  __n = str->_M_string_length;
  memcpy((this->data_).buf_,(str->_M_dataplus)._M_p,__n);
  (this->data_).buf_ = (this->data_).buf_ + __n;
  return;
}

Assistant:

inline void StringVectorEncoder::Add(const string& str) {
  offsets_.push_back(data_.length());
  data_.Ensure(str.size());
  data_.putn(str.data(), str.size());
}